

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  int *in_RDI;
  ImDrawCmd *curr_cmd;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38;
  if (*(int *)(local_20 + 0x20) != 0) {
    AddDrawCmd((ImDrawList *)callback_data);
    local_20 = *(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38;
  }
  *(undefined8 *)(local_20 + 0x28) = in_RSI;
  *(undefined8 *)(local_20 + 0x30) = in_RDX;
  AddDrawCmd((ImDrawList *)callback_data);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    }
    curr_cmd->UserCallback = callback;
    curr_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}